

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::walkTree<4,(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,MultiIndexSet *work,double *x,
          vector<int,_std::allocator<int>_> *sindx,vector<double,_std::allocator<double>_> *svals,
          double *y)

{
  pointer pdVar1;
  int *piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  int iVar7;
  int iVar8;
  bool isSupported;
  int p;
  int *r;
  double dx;
  vector<double,_std::allocator<double>_> basis_derivative;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  bool local_ad;
  int local_ac;
  value_type_conflict3 *local_a8;
  double local_a0;
  _Vector_base<double,_std::allocator<double>_> local_98;
  GridLocalPolynomial *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  _Vector_base<int,_std::allocator<int>_> local_70;
  int *local_58;
  MultiIndexSet *local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_78 = sindx;
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,(long)this->top_level + 1,
             (allocator_type *)&local_70);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_70,(long)this->top_level + 1,
             (allocator_type *)&local_98);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_98,
             (long)(this->super_BaseCanonicalGrid).num_dimensions,(allocator_type *)&local_a0);
  local_58 = (this->roots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  piVar2 = (this->roots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_80 = this;
  local_50 = work;
  while (piVar2 != local_58) {
    local_a8 = piVar2;
    diffBasisSupported<(TasGrid::RuleLocal::erule)2>
              (this,(work->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)*piVar2 * work->num_dimensions,x,
               local_98._M_impl.super__Vector_impl_data._M_start,&local_ad);
    if (local_ad == true) {
      ::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_78,local_a8);
      pdVar1 = local_98._M_impl.super__Vector_impl_data._M_finish;
      for (pdVar6 = local_98._M_impl.super__Vector_impl_data._M_start; pdVar6 != pdVar1;
          pdVar6 = pdVar6 + 1) {
        local_a0 = *pdVar6;
        ::std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)svals,&local_a0);
      }
      iVar8 = *local_a8;
      *local_70._M_impl.super__Vector_impl_data._M_start = iVar8;
      piVar4 = (local_80->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar8 = piVar4[iVar8];
      *local_48._M_impl.super__Vector_impl_data._M_start = iVar8;
      iVar7 = 0;
      piVar3 = local_70._M_impl.super__Vector_impl_data._M_start;
      piVar5 = local_48._M_impl.super__Vector_impl_data._M_start;
      this = local_80;
      while (iVar8 < piVar4[(long)*piVar3 + 1]) {
        if (piVar5[iVar7] < piVar4[(long)piVar3[iVar7] + 1]) {
          local_ac = (this->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[piVar5[iVar7]];
          diffBasisSupported<(TasGrid::RuleLocal::erule)2>
                    (this,(work->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (long)local_ac * work->num_dimensions,x
                     ,local_98._M_impl.super__Vector_impl_data._M_start,&local_ad);
          if (local_ad == true) {
            ::std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)local_78,&local_ac);
            pdVar1 = local_98._M_impl.super__Vector_impl_data._M_finish;
            for (pdVar6 = local_98._M_impl.super__Vector_impl_data._M_start; pdVar6 != pdVar1;
                pdVar6 = pdVar6 + 1) {
              local_a0 = *pdVar6;
              ::std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)svals,&local_a0);
            }
            local_70._M_impl.super__Vector_impl_data._M_start[(long)iVar7 + 1] = local_ac;
            piVar4 = (local_80->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_48._M_impl.super__Vector_impl_data._M_start[(long)iVar7 + 1] = piVar4[local_ac];
            piVar3 = local_70._M_impl.super__Vector_impl_data._M_start;
            piVar5 = local_48._M_impl.super__Vector_impl_data._M_start;
            work = local_50;
            this = local_80;
            iVar7 = iVar7 + 1;
          }
          else {
            local_48._M_impl.super__Vector_impl_data._M_start[iVar7] =
                 local_48._M_impl.super__Vector_impl_data._M_start[iVar7] + 1;
            piVar4 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar3 = local_70._M_impl.super__Vector_impl_data._M_start;
            piVar5 = local_48._M_impl.super__Vector_impl_data._M_start;
          }
        }
        else {
          piVar5[(long)iVar7 + -1] = piVar5[(long)iVar7 + -1] + 1;
          iVar7 = iVar7 + -1;
        }
        iVar8 = *piVar5;
      }
    }
    piVar2 = local_a8 + 1;
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_98);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void walkTree(const MultiIndexSet &work, const double x[], std::vector<int> &sindx, std::vector<double> &svals, double *y) const{
        std::vector<int> monkey_count(top_level+1); // traverse the tree, counts the branches of the current node
        std::vector<int> monkey_tail(top_level+1); // traverse the tree, keeps track of the previous node (history)

        bool isSupported;
        double basis_value;
        std::vector<double> basis_derivative(num_dimensions);

        for(const auto &r : roots){
            if (mode == 3 or mode == 4) {
                diffBasisSupported<effrule>(work.getIndex(r), x, basis_derivative.data(), isSupported);
            } else {
                basis_value = evalBasisSupported<effrule>(work.getIndex(r), x, isSupported);
            }

            if (isSupported){
                if (mode == 0){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        y[k] += basis_value * s[k];
                }else if (mode == 1 or mode == 2){
                    sindx.push_back(r);
                    svals.push_back(basis_value);
                }else if (mode == 3){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        for (int d=0; d<num_dimensions; d++)
                            y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                }else{
                    sindx.push_back(r);
                    for (auto dx : basis_derivative)
                        svals.push_back(dx);
                }

                int current = 0;
                monkey_tail[0] = r;
                monkey_count[0] = pntr[r];

                while(monkey_count[0] < pntr[monkey_tail[0]+1]){
                    if (monkey_count[current] < pntr[monkey_tail[current]+1]){
                        int p = indx[monkey_count[current]];
                        if (mode == 3 or mode == 4){
                            diffBasisSupported<effrule>(work.getIndex(p), x, basis_derivative.data(), isSupported);
                        }else{
                            basis_value = evalBasisSupported<effrule>(work.getIndex(p), x, isSupported);
                        }
                        if (isSupported){
                            if (mode == 0){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    y[k] += basis_value * s[k];
                            }else if (mode == 1 or mode == 2){
                                sindx.push_back(p);
                                svals.push_back(basis_value);
                            }else if (mode == 3){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    for (int d=0; d<num_dimensions; d++)
                                        y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                            }else{
                                sindx.push_back(p);
                                for (auto dx : basis_derivative)
                                    svals.push_back(dx);
                            }
                            monkey_tail[++current] = p;
                            monkey_count[current] = pntr[p];
                        }else{
                            monkey_count[current]++;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }

        // according to https://docs.nvidia.com/cuda/cusparse/index.html#sparse-format
        // "... it is assumed that the indices are provided in increasing order and that each index appears only once."
        // This may not be a requirement for cusparseDgemvi(), but it may be that I have not tested it sufficiently
        // Also, see AccelerationDataGPUFull::cusparseMatveci() for inaccuracies in Nvidia documentation
        if (mode == 2){
            std::vector<int> map(sindx);
            std::iota(map.begin(), map.end(), 0);
            std::sort(map.begin(), map.end(), [&](int a, int b)->bool{ return (sindx[a] < sindx[b]); });

            std::vector<int> idx = sindx;
            std::vector<double> vls = svals;
            std::transform(map.begin(), map.end(), sindx.begin(), [&](int i)->int{ return idx[i]; });
            std::transform(map.begin(), map.end(), svals.begin(), [&](int i)->double{ return vls[i]; });
        }
    }